

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O0

CostType __thiscall wasm::CostAnalyzer::visitArrayNewFixed(CostAnalyzer *this,ArrayNewFixed *curr)

{
  bool bVar1;
  uint uVar2;
  Expression **ppEVar3;
  Expression *child;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  CostType ret;
  ArrayNewFixed *curr_local;
  CostAnalyzer *this_local;
  
  __range2._4_4_ = 100;
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&(curr->values).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                     (&(curr->values).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end2.index,(Iterator *)&child);
    if (!bVar1) break;
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end2.index);
    uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,*ppEVar3);
    __range2._4_4_ = uVar2 + __range2._4_4_;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return __range2._4_4_;
}

Assistant:

CostType visitArrayNewFixed(ArrayNewFixed* curr) {
    CostType ret = AllocationCost;
    for (auto* child : curr->values) {
      ret += visit(child);
    }
    return ret;
  }